

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

opj_sparse_array_int32_t * opj_dwt_init_sparse_array(opj_tcd_tilecomp_t *tilec,OPJ_UINT32 numres)

{
  int iVar1;
  int iVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_cblk_enc_t *poVar5;
  OPJ_INT32 *src;
  OPJ_BOOL OVar6;
  opj_sparse_array_int32_t *sa;
  uint uVar7;
  OPJ_UINT32 OVar8;
  long lVar9;
  ulong uVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  uint uVar13;
  ulong uVar14;
  OPJ_UINT32 OVar15;
  ulong uVar16;
  opj_tcd_band_t *poVar17;
  ulong uVar18;
  
  poVar3 = tilec->resolutions;
  uVar7 = numres - 1;
  uVar13 = poVar3[uVar7].x1 - poVar3[uVar7].x0;
  uVar7 = poVar3[uVar7].y1 - poVar3[uVar7].y0;
  OVar12 = 0x40;
  if (uVar13 < 0x40) {
    OVar12 = uVar13;
  }
  OVar8 = 0x40;
  if (uVar7 < 0x40) {
    OVar8 = uVar7;
  }
  sa = opj_sparse_array_int32_create(uVar13,uVar7,OVar12,OVar8);
  if (sa == (opj_sparse_array_int32_t *)0x0) {
LAB_0010d1f1:
    sa = (opj_sparse_array_int32_t *)0x0;
  }
  else if (numres != 0) {
    uVar14 = 0;
    do {
      poVar3 = tilec->resolutions;
      uVar7 = poVar3[uVar14].numbands;
      if (uVar7 != 0) {
        uVar13 = (int)uVar14 - 1;
        OVar12 = poVar3[uVar14].pw;
        OVar8 = poVar3[uVar14].ph;
        uVar16 = 0;
        do {
          if (OVar8 * OVar12 != 0) {
            poVar17 = poVar3[uVar14].bands + uVar16;
            uVar10 = 0;
            do {
              poVar4 = poVar17->precincts;
              OVar15 = poVar4[uVar10].cw;
              OVar11 = poVar4[uVar10].ch;
              if (OVar11 * OVar15 != 0) {
                lVar9 = 0x10;
                uVar18 = 0;
                do {
                  poVar5 = poVar4[uVar10].cblks.enc;
                  src = *(OPJ_INT32 **)((long)&poVar5->data_size + lVar9);
                  if (src != (OPJ_INT32 *)0x0) {
                    iVar1 = *(int *)((long)&poVar5->data + lVar9);
                    OVar12 = iVar1 - poVar17->x0;
                    if ((poVar17->bandno & 1) != 0) {
                      OVar12 = (OVar12 + tilec->resolutions[uVar13].x1) -
                               tilec->resolutions[uVar13].x0;
                    }
                    iVar2 = *(int *)((long)&poVar5->data + lVar9 + 4);
                    OVar8 = iVar2 - poVar17->y0;
                    if ((poVar17->bandno & 2) != 0) {
                      OVar8 = (OVar8 + tilec->resolutions[uVar13].y1) -
                              tilec->resolutions[uVar13].y0;
                    }
                    OVar15 = *(int *)((long)&poVar5->layers + lVar9) - iVar1;
                    OVar6 = opj_sparse_array_int32_write
                                      (sa,OVar12,OVar8,OVar12 + OVar15,
                                       (*(int *)((long)&poVar5->layers + lVar9 + 4) - iVar2) + OVar8
                                       ,src,1,OVar15,1);
                    if (OVar6 == 0) {
                      opj_sparse_array_int32_free(sa);
                      goto LAB_0010d1f1;
                    }
                    OVar15 = poVar4[uVar10].cw;
                    OVar11 = poVar4[uVar10].ch;
                  }
                  uVar18 = uVar18 + 1;
                  lVar9 = lVar9 + 0x48;
                } while (uVar18 < OVar11 * OVar15);
                OVar12 = poVar3[uVar14].pw;
                OVar8 = poVar3[uVar14].ph;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < OVar8 * OVar12);
            uVar7 = poVar3[uVar14].numbands;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar7);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != numres);
  }
  return sa;
}

Assistant:

static opj_sparse_array_int32_t* opj_dwt_init_sparse_array(
    opj_tcd_tilecomp_t* tilec,
    OPJ_UINT32 numres)
{
    opj_tcd_resolution_t* tr_max = &(tilec->resolutions[numres - 1]);
    OPJ_UINT32 w = (OPJ_UINT32)(tr_max->x1 - tr_max->x0);
    OPJ_UINT32 h = (OPJ_UINT32)(tr_max->y1 - tr_max->y0);
    OPJ_UINT32 resno, bandno, precno, cblkno;
    opj_sparse_array_int32_t* sa = opj_sparse_array_int32_create(
                                       w, h, opj_uint_min(w, 64), opj_uint_min(h, 64));
    if (sa == NULL) {
        return NULL;
    }

    for (resno = 0; resno < numres; ++resno) {
        opj_tcd_resolution_t* res = &tilec->resolutions[resno];

        for (bandno = 0; bandno < res->numbands; ++bandno) {
            opj_tcd_band_t* band = &res->bands[bandno];

            for (precno = 0; precno < res->pw * res->ph; ++precno) {
                opj_tcd_precinct_t* precinct = &band->precincts[precno];
                for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                    opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                    if (cblk->decoded_data != NULL) {
                        OPJ_UINT32 x = (OPJ_UINT32)(cblk->x0 - band->x0);
                        OPJ_UINT32 y = (OPJ_UINT32)(cblk->y0 - band->y0);
                        OPJ_UINT32 cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
                        OPJ_UINT32 cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

                        if (band->bandno & 1) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            x += (OPJ_UINT32)(pres->x1 - pres->x0);
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            y += (OPJ_UINT32)(pres->y1 - pres->y0);
                        }

                        if (!opj_sparse_array_int32_write(sa, x, y,
                                                          x + cblk_w, y + cblk_h,
                                                          cblk->decoded_data,
                                                          1, cblk_w, OPJ_TRUE)) {
                            opj_sparse_array_int32_free(sa);
                            return NULL;
                        }
                    }
                }
            }
        }
    }

    return sa;
}